

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O3

void __thiscall QTableView::updateGeometries(QTableView *this)

{
  Representation RVar1;
  Representation RVar2;
  long lVar3;
  QHeaderViewPrivate *this_00;
  bool bVar4;
  Representation RVar5;
  LayoutDirection LVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ScrollMode SVar12;
  QSize QVar13;
  int extraout_var;
  long lVar14;
  QScrollBar *pQVar15;
  Representation RVar16;
  int iVar17;
  uint uVar18;
  Representation RVar19;
  Representation RVar20;
  long in_FS_OFFSET;
  Representation local_7c;
  undefined1 local_58 [8];
  undefined8 uStack_50;
  QMetaTypeInterface *local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  if (*(char *)(lVar3 + 0x641) == '\0') {
    *(undefined1 *)(lVar3 + 0x641) = 1;
    RVar5.m_i = 0;
    if (((*(QWidget **)(lVar3 + 0x588))->data->widget_attributes & 0x10000) == 0) {
      QVar13 = QWidget::minimumSize(*(QWidget **)(lVar3 + 0x588));
      RVar5.m_i = (**(code **)(**(long **)(lVar3 + 0x588) + 0x70))();
      if (RVar5.m_i < QVar13.wd.m_i.m_i) {
        RVar5.m_i = QVar13.wd.m_i.m_i;
      }
      QVar13 = QWidget::maximumSize(*(QWidget **)(lVar3 + 0x588));
      if (QVar13.wd.m_i.m_i <= RVar5.m_i) {
        RVar5.m_i = QVar13.wd.m_i.m_i;
      }
    }
    RVar19.m_i = 0;
    if (((*(QWidget **)(lVar3 + 0x580))->data->widget_attributes & 0x10000) == 0) {
      QVar13 = QWidget::minimumSize(*(QWidget **)(lVar3 + 0x580));
      (**(code **)(**(long **)(lVar3 + 0x580) + 0x70))();
      RVar19.m_i = extraout_var;
      if (extraout_var < QVar13.ht.m_i.m_i) {
        RVar19.m_i = QVar13.ht.m_i.m_i;
      }
      QVar13 = QWidget::maximumSize(*(QWidget **)(lVar3 + 0x580));
      if (QVar13.ht.m_i.m_i <= RVar19.m_i) {
        RVar19.m_i = QVar13.ht.m_i.m_i;
      }
    }
    LVar6 = QWidget::layoutDirection((QWidget *)this);
    if (LVar6 == RightToLeft) {
      QAbstractScrollArea::setViewportMargins((QAbstractScrollArea *)this,0,RVar19.m_i,RVar5.m_i,0);
      lVar14 = *(long *)(*(long *)(lVar3 + 0x2b0) + 0x20);
      local_7c.m_i = *(int *)(lVar14 + 0x14);
      RVar1.m_i = *(int *)(lVar14 + 0x1c);
      RVar16.m_i = RVar1.m_i + 1;
    }
    else {
      QAbstractScrollArea::setViewportMargins((QAbstractScrollArea *)this,RVar5.m_i,RVar19.m_i,0,0);
      lVar14 = *(long *)(*(long *)(lVar3 + 0x2b0) + 0x20);
      local_7c.m_i = *(int *)(lVar14 + 0x14);
      RVar1.m_i = *(int *)(lVar14 + 0x1c);
      RVar16.m_i = local_7c.m_i - RVar5.m_i;
    }
    RVar2.m_i = *(int *)(lVar14 + 0x18);
    local_58._4_4_ = RVar2.m_i;
    local_58._0_4_ = RVar16.m_i;
    RVar20.m_i = RVar5.m_i + RVar16.m_i + -1;
    uStack_50 = (char *)CONCAT44(*(int *)(lVar14 + 0x20),RVar20.m_i);
    QWidget::setGeometry(*(QWidget **)(lVar3 + 0x588),(QRect *)local_58);
    if ((*(byte *)(*(long *)(*(QObject **)(lVar3 + 0x588) + 0x20) + 10) & 1) != 0) {
      local_58 = (undefined1  [8])0x0;
      uStack_50 = (char *)0x0;
      local_48[0] = (QMetaTypeInterface *)0x0;
      QMetaObject::invokeMethodImpl
                (*(QObject **)(lVar3 + 0x588),"updateGeometries",AutoConnection,1,(void **)local_58,
                 (char **)&uStack_50,local_48);
    }
    local_58._4_4_ = RVar2.m_i - RVar19.m_i;
    local_58._0_4_ = local_7c.m_i;
    uStack_50 = (char *)CONCAT44(RVar2.m_i + -1,RVar1.m_i);
    QWidget::setGeometry(*(QWidget **)(lVar3 + 0x580),(QRect *)local_58);
    uVar18 = *(uint *)(*(long *)(*(QObject **)(lVar3 + 0x580) + 0x20) + 8);
    if ((uVar18 >> 0x10 & 1) != 0) {
      local_58 = (undefined1  [8])0x0;
      uStack_50 = (char *)0x0;
      local_48[0] = (QMetaTypeInterface *)0x0;
      QMetaObject::invokeMethodImpl
                (*(QObject **)(lVar3 + 0x580),"updateGeometries",AutoConnection,1,(void **)local_58,
                 (char **)&uStack_50,local_48);
      uVar18 = *(uint *)(*(long *)(*(long *)(lVar3 + 0x580) + 0x20) + 8);
    }
    if (((uVar18 >> 0x10 & 1) == 0) &&
       ((*(byte *)(*(long *)(*(long *)(lVar3 + 0x588) + 0x20) + 10) & 1) == 0)) {
      QWidget::setHidden(*(QWidget **)(lVar3 + 0x590),false);
      local_58._0_4_ = RVar16.m_i;
      uStack_50 = (char *)CONCAT44(RVar2.m_i + -1,RVar20.m_i);
      QWidget::setGeometry(*(QWidget **)(lVar3 + 0x590),(QRect *)local_58);
    }
    else {
      QWidget::setHidden(*(QWidget **)(lVar3 + 0x590),true);
    }
    lVar14 = *(long *)(*(long *)(lVar3 + 0x2b0) + 0x20);
    iVar9 = *(int *)(lVar14 + 0x1c);
    iVar17 = *(int *)(lVar14 + 0x20);
    iVar11 = *(int *)(lVar14 + 0x14);
    iVar10 = *(int *)(lVar14 + 0x18);
    QVar13 = QAbstractScrollArea::maximumViewportSize((QAbstractScrollArea *)this);
    iVar7 = QHeaderView::length(*(QHeaderView **)(lVar3 + 0x580));
    iVar8 = QHeaderView::length(*(QHeaderView **)(lVar3 + 0x588));
    RVar19.m_i = (iVar9 - iVar11) + 1;
    RVar5.m_i = (iVar17 - iVar10) + 1;
    if (iVar8 <= QVar13.ht.m_i.m_i && iVar7 <= QVar13.wd.m_i.m_i) {
      RVar19.m_i = QVar13.wd.m_i.m_i;
      RVar5.m_i = QVar13.ht.m_i.m_i;
    }
    iVar9 = QHeaderView::count(*(QHeaderView **)(lVar3 + 0x580));
    if (iVar9 < 1) {
      iVar17 = 0;
    }
    else {
      uVar18 = iVar9 + 1;
      iVar11 = 0;
      iVar17 = 0;
      do {
        iVar10 = QHeaderView::logicalIndex(*(QHeaderView **)(lVar3 + 0x580),uVar18 - 2);
        bVar4 = QHeaderView::isSectionHidden(*(QHeaderView **)(lVar3 + 0x580),iVar10);
        if (!bVar4) {
          iVar10 = QHeaderView::sectionSize(*(QHeaderView **)(lVar3 + 0x580),iVar10);
          iVar11 = iVar10 + iVar11;
          if (RVar19.m_i < iVar11) break;
          iVar17 = iVar17 + 1;
        }
        uVar18 = uVar18 - 1;
      } while (1 < uVar18);
    }
    iVar11 = 1;
    if (1 < iVar17) {
      iVar11 = iVar17;
    }
    SVar12 = QAbstractItemView::horizontalScrollMode((QAbstractItemView *)this);
    if (SVar12 == ScrollPerItem) {
      iVar17 = QHeaderView::hiddenSectionCount(*(QHeaderView **)(lVar3 + 0x580));
      pQVar15 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
      QAbstractSlider::setRange(&pQVar15->super_QAbstractSlider,0,(iVar9 - iVar17) - iVar11);
      pQVar15 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
      QAbstractSlider::setPageStep(&pQVar15->super_QAbstractSlider,iVar11);
      if (iVar9 - iVar17 <= iVar11) {
        QHeaderView::setOffset(*(QHeaderView **)(lVar3 + 0x580),0);
      }
      pQVar15 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
      QAbstractSlider::setSingleStep(&pQVar15->super_QAbstractSlider,1);
    }
    else {
      pQVar15 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
      QAbstractSlider::setPageStep(&pQVar15->super_QAbstractSlider,RVar19.m_i);
      pQVar15 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
      QAbstractSlider::setRange(&pQVar15->super_QAbstractSlider,0,iVar7 - RVar19.m_i);
      pQVar15 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
      iVar17 = RVar19.m_i / (iVar11 + 1);
      iVar9 = 2;
      if (2 < iVar17) {
        iVar9 = iVar17;
      }
      QAbstractSliderPrivate::itemviewChangeSingleStep
                (*(QAbstractSliderPrivate **)
                  &(pQVar15->super_QAbstractSlider).super_QWidget.field_0x8,iVar9);
    }
    iVar9 = QHeaderView::count(*(QHeaderView **)(lVar3 + 0x588));
    if (iVar9 < 1) {
      iVar17 = 0;
    }
    else {
      uVar18 = iVar9 + 1;
      iVar11 = 0;
      iVar17 = 0;
      do {
        iVar10 = QHeaderView::logicalIndex(*(QHeaderView **)(lVar3 + 0x588),uVar18 - 2);
        bVar4 = QHeaderView::isSectionHidden(*(QHeaderView **)(lVar3 + 0x588),iVar10);
        if (!bVar4) {
          iVar10 = QHeaderView::sectionSize(*(QHeaderView **)(lVar3 + 0x588),iVar10);
          iVar11 = iVar10 + iVar11;
          if (RVar5.m_i < iVar11) break;
          iVar17 = iVar17 + 1;
        }
        uVar18 = uVar18 - 1;
      } while (1 < uVar18);
    }
    iVar11 = 1;
    if (1 < iVar17) {
      iVar11 = iVar17;
    }
    SVar12 = QAbstractItemView::verticalScrollMode((QAbstractItemView *)this);
    if (SVar12 == ScrollPerItem) {
      iVar17 = QHeaderView::hiddenSectionCount(*(QHeaderView **)(lVar3 + 0x588));
      pQVar15 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
      QAbstractSlider::setRange(&pQVar15->super_QAbstractSlider,0,(iVar9 - iVar17) - iVar11);
      pQVar15 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
      QAbstractSlider::setPageStep(&pQVar15->super_QAbstractSlider,iVar11);
      if (iVar9 - iVar17 <= iVar11) {
        QHeaderView::setOffset(*(QHeaderView **)(lVar3 + 0x588),0);
      }
      pQVar15 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
      QAbstractSlider::setSingleStep(&pQVar15->super_QAbstractSlider,1);
    }
    else {
      pQVar15 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
      QAbstractSlider::setPageStep(&pQVar15->super_QAbstractSlider,RVar5.m_i);
      pQVar15 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
      QAbstractSlider::setRange(&pQVar15->super_QAbstractSlider,0,iVar8 - RVar5.m_i);
      pQVar15 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
      iVar17 = RVar5.m_i / (iVar11 + 1);
      iVar9 = 2;
      if (2 < iVar17) {
        iVar9 = iVar17;
      }
      QAbstractSliderPrivate::itemviewChangeSingleStep
                (*(QAbstractSliderPrivate **)
                  &(pQVar15->super_QAbstractSlider).super_QWidget.field_0x8,iVar9);
    }
    this_00 = *(QHeaderViewPrivate **)(*(long *)(lVar3 + 0x588) + 8);
    pQVar15 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
    SVar12 = QAbstractItemView::verticalScrollMode((QAbstractItemView *)this);
    QHeaderViewPrivate::setScrollOffset(this_00,pQVar15,SVar12);
    *(undefined1 *)(lVar3 + 0x641) = 0;
    QAbstractItemView::updateGeometries((QAbstractItemView *)this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableView::updateGeometries()
{
    Q_D(QTableView);
    if (d->geometryRecursionBlock)
        return;
    d->geometryRecursionBlock = true;

    int width = 0;
    if (!d->verticalHeader->isHidden()) {
        width = qMax(d->verticalHeader->minimumWidth(), d->verticalHeader->sizeHint().width());
        width = qMin(width, d->verticalHeader->maximumWidth());
    }
    int height = 0;
    if (!d->horizontalHeader->isHidden()) {
        height = qMax(d->horizontalHeader->minimumHeight(), d->horizontalHeader->sizeHint().height());
        height = qMin(height, d->horizontalHeader->maximumHeight());
    }
    bool reverse = isRightToLeft();
     if (reverse)
         setViewportMargins(0, height, width, 0);
     else
         setViewportMargins(width, height, 0, 0);

    // update headers

    QRect vg = d->viewport->geometry();

    int verticalLeft = reverse ? vg.right() + 1 : (vg.left() - width);
    d->verticalHeader->setGeometry(verticalLeft, vg.top(), width, vg.height());
    if (d->verticalHeader->isHidden())
        QMetaObject::invokeMethod(d->verticalHeader, "updateGeometries");

    int horizontalTop = vg.top() - height;
    d->horizontalHeader->setGeometry(vg.left(), horizontalTop, vg.width(), height);
    if (d->horizontalHeader->isHidden())
        QMetaObject::invokeMethod(d->horizontalHeader, "updateGeometries");

#if QT_CONFIG(abstractbutton)
    // update cornerWidget
    if (d->horizontalHeader->isHidden() || d->verticalHeader->isHidden()) {
        d->cornerWidget->setHidden(true);
    } else {
        d->cornerWidget->setHidden(false);
        d->cornerWidget->setGeometry(verticalLeft, horizontalTop, width, height);
    }
#endif

    // update scroll bars

    // ### move this block into the if
    QSize vsize = d->viewport->size();
    QSize max = maximumViewportSize();
    const int horizontalLength = d->horizontalHeader->length();
    const int verticalLength = d->verticalHeader->length();
    if (max.width() >= horizontalLength && max.height() >= verticalLength)
        vsize = max;

    // horizontal scroll bar
    const int columnCount = d->horizontalHeader->count();
    const int viewportWidth = vsize.width();
    int columnsInViewport = 0;
    for (int width = 0, column = columnCount - 1; column >= 0; --column) {
        int logical = d->horizontalHeader->logicalIndex(column);
        if (!d->horizontalHeader->isSectionHidden(logical)) {
            width += d->horizontalHeader->sectionSize(logical);
            if (width > viewportWidth)
                break;
            ++columnsInViewport;
        }
    }
    columnsInViewport = qMax(columnsInViewport, 1); //there must be always at least 1 column

    if (horizontalScrollMode() == QAbstractItemView::ScrollPerItem) {
        const int visibleColumns = columnCount - d->horizontalHeader->hiddenSectionCount();
        horizontalScrollBar()->setRange(0, visibleColumns - columnsInViewport);
        horizontalScrollBar()->setPageStep(columnsInViewport);
        if (columnsInViewport >= visibleColumns)
            d->horizontalHeader->setOffset(0);
        horizontalScrollBar()->setSingleStep(1);
    } else { // ScrollPerPixel
        horizontalScrollBar()->setPageStep(vsize.width());
        horizontalScrollBar()->setRange(0, horizontalLength - vsize.width());
        horizontalScrollBar()->d_func()->itemviewChangeSingleStep(qMax(vsize.width() / (columnsInViewport + 1), 2));
    }

    // vertical scroll bar
    const int rowCount = d->verticalHeader->count();
    const int viewportHeight = vsize.height();
    int rowsInViewport = 0;
    for (int height = 0, row = rowCount - 1; row >= 0; --row) {
        int logical = d->verticalHeader->logicalIndex(row);
        if (!d->verticalHeader->isSectionHidden(logical)) {
            height += d->verticalHeader->sectionSize(logical);
            if (height > viewportHeight)
                break;
            ++rowsInViewport;
        }
    }
    rowsInViewport = qMax(rowsInViewport, 1); //there must be always at least 1 row

    if (verticalScrollMode() == QAbstractItemView::ScrollPerItem) {
        const int visibleRows = rowCount - d->verticalHeader->hiddenSectionCount();
        verticalScrollBar()->setRange(0, visibleRows - rowsInViewport);
        verticalScrollBar()->setPageStep(rowsInViewport);
        if (rowsInViewport >= visibleRows)
            d->verticalHeader->setOffset(0);
        verticalScrollBar()->setSingleStep(1);
    } else { // ScrollPerPixel
        verticalScrollBar()->setPageStep(vsize.height());
        verticalScrollBar()->setRange(0, verticalLength - vsize.height());
        verticalScrollBar()->d_func()->itemviewChangeSingleStep(qMax(vsize.height() / (rowsInViewport + 1), 2));
    }
    d->verticalHeader->d_func()->setScrollOffset(verticalScrollBar(), verticalScrollMode());

    d->geometryRecursionBlock = false;
    QAbstractItemView::updateGeometries();
}